

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  _Base_ptr p_Var1;
  bool bVar2;
  value_type *pvVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  size_t *psVar7;
  ulong uVar8;
  pointer pcVar9;
  Logger *pLVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar11;
  value_type *__u;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this;
  OutputGroup *group;
  pointer pOVar12;
  long lVar13;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  pointer pOVar14;
  pointer pOVar15;
  long in_FS_OFFSET;
  bool bVar16;
  string_view logging_function;
  string_view source_file;
  int iterations;
  undefined8 uVar17;
  long local_3e8;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  CAmount local_3a0;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_308 [8];
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  CAmount local_2d8;
  undefined8 uStack_2d0;
  _Storage<long,_true> local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  size_t sStack_2b0;
  undefined8 local_2a8;
  CAmount CStack_2a0;
  string local_298;
  string local_278;
  string log_message;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_238 [8];
  _Rb_tree_node_base local_230;
  size_t local_210;
  CAmount local_208;
  ulong uStack_200;
  _Storage<long,_true> local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  size_t sStack_1e0;
  undefined8 local_1d8;
  CAmount CStack_1d0;
  undefined1 *local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 uStack_1b0;
  undefined4 uStack_1af;
  undefined2 uStack_1ab;
  undefined1 uStack_1a9;
  undefined8 *local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_188 [8];
  _Rb_tree_node_base local_180;
  size_t local_160;
  CAmount local_158;
  undefined8 uStack_150;
  _Storage<long,_true> local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  size_t sStack_130;
  undefined8 local_128;
  CAmount CStack_120;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_118 [8];
  _Rb_tree_node_base local_110;
  size_t local_f0;
  CAmount local_e8;
  ulong uStack_e0;
  _Storage<long,_true> local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  size_t sStack_c0;
  undefined8 local_b8;
  CAmount CStack_b0;
  SelectionResult local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_target = *nTargetValue;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_algo = KNAPSACK;
  local_a8.m_use_effective = false;
  local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_a8.m_algo_completed = true;
  local_a8.m_weight = 0;
  local_a8.bump_fee_group_discount = 0;
  lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
  super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0 = 0;
  uVar17 = 0x56529e;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish,rng);
  iterations = (int)uVar17;
  __u = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_3e8 = local_3a0;
  bVar16 = __u == pvVar3;
  if (bVar16) {
    bVar5 = false;
  }
  else {
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    bVar5 = false;
    do {
      if (max_selection_weight < __u->m_weight) {
        bVar5 = true;
        iVar6 = 3;
      }
      else {
        lVar4 = *(long *)((long)&__u->m_value + (ulong)((__u->m_subtract_fee_outputs ^ 1) << 5));
        if (lVar4 == *nTargetValue) {
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&local_a8,&__u->m_outputs);
          bVar2 = __u->m_subtract_fee_outputs;
          local_a8.m_use_effective = (bool)(bVar2 ^ 1);
          local_a8.m_weight = local_a8.m_weight + __u->m_weight;
          if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) {
            local_110._M_color = _S_red;
            local_110._M_parent = (_Base_ptr)0x0;
            psVar7 = &local_f0;
            local_110._M_left = &local_110;
            local_110._M_right = &local_110;
          }
          else {
            local_110._M_color =
                 local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            local_110._M_parent =
                 local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_110._M_left =
                 local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_110._M_right =
                 local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
            _M_parent = &local_110;
            local_f0 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
            psVar7 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          *psVar7 = 0;
          uStack_e0 = CONCAT62(local_a8._58_6_,CONCAT11(bVar2,local_a8.m_algo)) ^ 0x100;
          uStack_d0 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._9_7_,
                               local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_engaged);
          local_c8 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
          local_b8 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
          CStack_b0 = local_a8.bump_fee_group_discount;
          sStack_c0 = local_a8.m_selections_evaluated;
          local_d8 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
          local_e8 = local_a8.m_target;
          if (local_110._M_parent == (_Base_ptr)0x0) {
            *(undefined4 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 0;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
                 p_Var1;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
                 p_Var1;
            psVar7 = (size_t *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                     0x28);
          }
          else {
            *(_Rb_tree_color *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
                 local_110._M_color;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 local_110._M_parent;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
                 local_110._M_left;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
                 local_110._M_right;
            (local_110._M_parent)->_M_parent = p_Var1;
            *(size_t *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
                 local_f0;
            local_110._M_parent = (_Base_ptr)0x0;
            psVar7 = &local_f0;
            local_110._M_left = &local_110;
            local_110._M_right = &local_110;
          }
          *psVar7 = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
               local_b8;
          *(CAmount *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
               CStack_b0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
               local_c8;
          *(size_t *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
               sStack_c0;
          *(_Storage<long,_true> *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
               local_d8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
               uStack_d0;
          *(CAmount *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
               local_e8;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                    0x38) = uStack_e0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
               '\x01';
          uVar17 = 0x565564;
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree(local_118);
          iVar6 = 1;
        }
        else {
          if (lVar4 < *nTargetValue + change_target) {
            uVar17 = 0x5653d6;
            std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                      (&applicable_groups,__u);
            local_3e8 = local_3e8 +
                        *(long *)((long)&__u->m_value +
                                 (ulong)((__u->m_subtract_fee_outputs ^ 1) << 5));
          }
          else if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload
                    .super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_engaged != true) ||
                  (lVar4 < *(long *)(local_308 +
                                    ((ulong)((lowest_larger.
                                              super__Optional_base<wallet::OutputGroup,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                              .super__Optional_payload_base<wallet::OutputGroup>.
                                              _M_payload._M_value.m_subtract_fee_outputs ^ 1) << 5)
                                    - 0x50)))) {
            uVar17 = 0x565428;
            std::optional<wallet::OutputGroup>::operator=(&lowest_larger,__u);
          }
          iVar6 = 0;
        }
      }
      iterations = (int)uVar17;
      if ((iVar6 != 3) && (iVar6 != 0)) break;
      __u = __u + 1;
      bVar16 = __u == pvVar3;
    } while (!bVar16);
  }
  pOVar15 = applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_3a0 = local_3e8;
  if (!bVar16) goto LAB_0056601b;
  if (local_3e8 == *nTargetValue) {
    if (applicable_groups.
        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
        super__Vector_impl_data._M_start !=
        applicable_groups.
        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pOVar12 = applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&local_a8,&pOVar12->m_outputs);
        local_a8.m_use_effective = (bool)(pOVar12->m_subtract_fee_outputs ^ 1);
        local_a8.m_weight = local_a8.m_weight + pOVar12->m_weight;
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 != pOVar15);
    }
    if (max_selection_weight < local_a8.m_weight) {
      iterations = 0x56561c;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
      if (local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = false;
      }
      local_a8.m_weight = 0;
      bVar5 = true;
      goto LAB_00565641;
    }
    if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      psVar7 = &local_160;
      local_180._M_color = _S_red;
      local_180._M_parent = (_Base_ptr)0x0;
      local_180._M_left = &local_180;
      local_180._M_right = &local_180;
    }
    else {
      psVar7 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_180._M_color =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_180._M_parent =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_180._M_left =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_180._M_right =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
           = &local_180;
      local_160 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    *psVar7 = 0;
    uStack_150 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
    uStack_140 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._9_7_,
                          local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
    local_138 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
    local_128 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
    CStack_120 = local_a8.bump_fee_group_discount;
    sStack_130 = local_a8.m_selections_evaluated;
    local_148 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload;
    local_158 = local_a8.m_target;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (local_180._M_parent == (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var1
      ;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var1
      ;
      psVar7 = (size_t *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28);
    }
    else {
      psVar7 = &local_160;
      *(_Rb_tree_color *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_180._M_color;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           local_180._M_parent;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
           local_180._M_left;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           local_180._M_right;
      (local_180._M_parent)->_M_parent = p_Var1;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_160;
      local_180._M_parent = (_Base_ptr)0x0;
      local_180._M_left = &local_180;
      local_180._M_right = &local_180;
    }
    *psVar7 = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_128;
    *(CAmount *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         CStack_120;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_138;
    *(size_t *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         sStack_130;
    *(_Storage<long,_true> *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_148;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         uStack_140;
    *(CAmount *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_158;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         uStack_150;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = local_188;
  }
  else {
LAB_00565641:
    pOVar12 = applicable_groups.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pOVar15 = applicable_groups.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (*nTargetValue <= local_3e8) {
      if (applicable_groups.
          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
          super__Vector_impl_data._M_start !=
          applicable_groups.
          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar13 = (long)applicable_groups.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)applicable_groups.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (lVar13 >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar4 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (applicable_groups.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   applicable_groups.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar13 < 0x681) {
          iterations = 0x565813;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar15,pOVar12);
        }
        else {
          pOVar14 = pOVar15 + 0x10;
          iterations = 0x56575c;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar15,pOVar14);
          for (; pOVar14 != pOVar12; pOVar14 = pOVar14 + 1) {
            iterations = 0x565772;
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                      (pOVar14);
          }
        }
      }
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ApproximateBestSubset
                (rng,&applicable_groups,&local_3a0,nTargetValue,&vfBest,&nBest,max_selection_weight,
                 iterations);
      if ((nBest != *nTargetValue) &&
         (pcVar9 = (pointer)(*nTargetValue + change_target), (long)pcVar9 <= local_3e8)) {
        log_message._M_dataplus._M_p = pcVar9;
        ApproximateBestSubset
                  (rng,&applicable_groups,&local_3a0,(CAmount *)&log_message,&vfBest,&nBest,
                   max_selection_weight,iterations);
      }
      if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
           super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) &&
         ((nBest != *nTargetValue && nBest < change_target + *nTargetValue ||
          (*(long *)(local_308 +
                    ((ulong)((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                              super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                              m_subtract_fee_outputs ^ 1) << 5) - 0x50)) <= nBest)))) {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&local_a8,
                   (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)&lowest_larger);
        local_a8.m_use_effective =
             (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload
                    .super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                    m_subtract_fee_outputs ^ 1);
        local_a8.m_weight =
             local_a8.m_weight +
             lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
LAB_00565c08:
        if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          psVar7 = &local_2e0;
          local_300._M_color = _S_red;
          local_300._M_parent = (_Base_ptr)0x0;
          local_300._M_left = &local_300;
          local_300._M_right = &local_300;
        }
        else {
          psVar7 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_300._M_color =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_300._M_parent =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_300._M_left =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_300._M_right =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = &local_300;
          local_2e0 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *psVar7 = 0;
        uStack_2d0 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
        uStack_2c0 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._9_7_,
                              local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        local_2b8 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
        local_2a8 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
        CStack_2a0 = local_a8.bump_fee_group_discount;
        sStack_2b0 = local_a8.m_selections_evaluated;
        local_2c8 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_payload;
        local_2d8 = local_a8.m_target;
        p_Var1 = (_Base_ptr)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
        if (local_300._M_parent == (_Base_ptr)0x0) {
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               p_Var1;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               p_Var1;
          psVar7 = (size_t *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                   0x28);
        }
        else {
          psVar7 = &local_2e0;
          *(_Rb_tree_color *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
               local_300._M_color;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
               local_300._M_parent;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               local_300._M_left;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               local_300._M_right;
          (local_300._M_parent)->_M_parent = p_Var1;
          *(size_t *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
               local_2e0;
          local_300._M_parent = (_Base_ptr)0x0;
          local_300._M_left = &local_300;
          local_300._M_right = &local_300;
        }
        *psVar7 = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
             local_2a8;
        *(CAmount *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
             CStack_2a0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
             local_2b8;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
             sStack_2b0;
        *(_Storage<long,_true> *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
             local_2c8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
             uStack_2c0;
        *(CAmount *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
             local_2d8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
             uStack_2d0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
             '\x01';
        _GLOBAL__N_1::std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree(local_308);
      }
      else {
        if (applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar8 = 0;
          uVar11 = 1;
          do {
            if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] != '\0') {
              pOVar15 = applicable_groups.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar8;
              SelectionResult::
              InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                        (&local_a8,&pOVar15->m_outputs);
              local_a8.m_use_effective = (bool)(pOVar15->m_subtract_fee_outputs ^ 1);
              local_a8.m_weight = local_a8.m_weight + pOVar15->m_weight;
            }
            uVar8 = ((long)applicable_groups.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)applicable_groups.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
            bVar16 = uVar11 <= uVar8;
            lVar4 = uVar8 - uVar11;
            uVar8 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar16 && lVar4 != 0);
        }
        if (local_a8.m_weight <= max_selection_weight) {
LAB_005659e1:
          pLVar10 = LogInstance();
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar10,SELECTCOINS,Debug);
          if (bVar16) {
            log_message._M_dataplus._M_p = (pointer)&log_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&log_message,"Coin selection best subset: ","");
            if (applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar8 = 0;
              uVar11 = 1;
              do {
                if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8] != '\0') {
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar8 * 0x68);
                  FormatMoney_abi_cxx11_
                            (&local_298,
                             applicable_groups.
                             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar8].m_value);
                  tinyformat::format<std::__cxx11::string>
                            (&local_278,(tinyformat *)0x8606cd,(char *)&local_298,args);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&log_message,local_278._M_dataplus._M_p,local_278._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    local_278.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != &local_298.field_2) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    local_298.field_2._M_allocated_capacity + 1);
                  }
                }
                uVar8 = ((long)applicable_groups.
                               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)applicable_groups.
                               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
                bVar16 = uVar11 <= uVar8;
                lVar4 = uVar8 - uVar11;
                uVar8 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar16 && lVar4 != 0);
            }
            pLVar10 = LogInstance();
            bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar10,SELECTCOINS,Debug);
            if (bVar16) {
              FormatMoney_abi_cxx11_(&local_278,nBest);
              logging_function._M_str = "KnapsackSolver";
              logging_function._M_len = 0xe;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
              ;
              source_file._M_len = 0x68;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function,source_file,0x2e7,SELECTCOINS,Debug,
                         (ConstevalFormatString<2U>)0x8496a0,&log_message,&local_278);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)log_message._M_dataplus._M_p != &log_message.field_2) {
              operator_delete(log_message._M_dataplus._M_p,
                              log_message.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_00565c08;
        }
        if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
            super__Optional_payload_base<wallet::OutputGroup>._M_engaged != false) {
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_a8);
          if (local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == true) {
            local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged = false;
          }
          local_a8.m_weight = 0;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&local_a8,
                     (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)&lowest_larger);
          local_a8.m_use_effective =
               (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                      _M_payload.super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                      super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                      m_subtract_fee_outputs ^ 1);
          local_a8.m_weight =
               local_a8.m_weight +
               lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
               super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
               super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
          goto LAB_005659e1;
        }
        ErrorMaxWeightExceeded();
      }
      if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_0056601b;
    }
    if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
        super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) {
      if (bVar5) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_1a8 = &local_198;
        uStack_1b7 = 0;
        uStack_1b0 = 0;
        uStack_1af = 0;
        uStack_1ab = 0;
        uStack_1a9 = 0;
        uStack_190 = 0;
        local_1c8 = &local_1b8;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x11) = 0;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x19) = 0;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1d) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1f) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        uStack_1c0 = 0;
        local_1b8 = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        uStack_1a0 = 0;
        local_198 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
      }
      goto LAB_0056601b;
    }
    SelectionResult::
    InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
              (&local_a8,
               (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)&lowest_larger);
    local_a8.m_use_effective =
         (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                m_subtract_fee_outputs ^ 1);
    local_a8.m_weight =
         local_a8.m_weight +
         lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
         super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
         super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
    if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      psVar7 = &local_210;
      local_230._M_color = _S_red;
      local_230._M_parent = (_Base_ptr)0x0;
      local_230._M_left = &local_230;
      local_230._M_right = &local_230;
    }
    else {
      psVar7 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_230._M_color =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_230._M_parent =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_230._M_left =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_230._M_right =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
           = &local_230;
      local_210 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    *psVar7 = 0;
    uStack_200 = CONCAT62(local_a8._58_6_,
                          CONCAT11(lowest_larger.
                                   super__Optional_base<wallet::OutputGroup,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                                   super__Optional_payload_base<wallet::OutputGroup>._M_payload.
                                   _M_value.m_subtract_fee_outputs,local_a8.m_algo)) ^ 0x100;
    uStack_1f0 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._9_7_,
                          local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
    local_1e8 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
    local_1d8 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
    CStack_1d0 = local_a8.bump_fee_group_discount;
    sStack_1e0 = local_a8.m_selections_evaluated;
    local_1f8 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload;
    local_208 = local_a8.m_target;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (local_230._M_parent == (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var1
      ;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var1
      ;
      psVar7 = (size_t *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28);
    }
    else {
      psVar7 = &local_210;
      *(_Rb_tree_color *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_230._M_color;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           local_230._M_parent;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
           local_230._M_left;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           local_230._M_right;
      (local_230._M_parent)->_M_parent = p_Var1;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_210;
      local_230._M_parent = (_Base_ptr)0x0;
      local_230._M_left = &local_230;
      local_230._M_right = &local_230;
    }
    *psVar7 = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_1d8;
    *(CAmount *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         CStack_1d0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_1e8;
    *(size_t *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         sStack_1e0;
    *(_Storage<long,_true> *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_1f8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         uStack_1f0;
    *(CAmount *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_208;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         uStack_200;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = local_238;
  }
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(this);
LAB_0056601b:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
            (&applicable_groups);
  if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
      super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) {
    lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
    super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    ~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)&lowest_larger);
  }
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}